

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void Scrollbar(ImGuiWindow *window,bool horizontal)

{
  ImGuiID IVar1;
  ImDrawList *this;
  undefined1 auVar2 [12];
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  undefined4 id;
  bool bVar5;
  ImU32 IVar6;
  uint uVar7;
  undefined7 extraout_var;
  float *pfVar8;
  ImRect *pIVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  ImGuiCol idx;
  int iVar11;
  long lVar12;
  char cVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  int iVar19;
  float fVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar18 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  float fVar35;
  ImRect IVar36;
  undefined8 uStack_e0;
  bool hovered;
  bool held;
  ImRect local_c8;
  undefined1 local_b8 [16];
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ImGuiContext *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ImVec2 local_58;
  ImVec2 local_50;
  undefined1 local_48 [24];
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  
  pIVar3 = GImGui;
  local_68._8_8_ = local_68._0_8_;
  local_78._8_8_ = local_78._0_8_;
  uVar14 = CONCAT71(in_register_00000031,horizontal) & 0xffffffff;
  pcVar10 = "#SCROLLY";
  if ((int)CONCAT71(in_register_00000031,horizontal) != 0) {
    pcVar10 = "#SCROLLX";
  }
  local_b8._0_4_ = ImGuiWindow::GetID(window,pcVar10,(char *)0x0);
  bVar5 = (&window->ScrollbarX)[uVar14];
  local_a8 = 0.0;
  if (bVar5 == true) {
    local_a8 = (pIVar3->Style).ScrollbarSize;
  }
  IVar36 = ImGuiWindow::Rect(window);
  fVar16 = window->BorderSize;
  cVar13 = (char)uVar14;
  local_c8.Max.x = IVar36.Max.x;
  local_c8.Max.y = IVar36.Max.y;
  if (cVar13 == '\0') {
    local_c8.Min.x = local_c8.Max.x - (pIVar3->Style).ScrollbarSize;
    local_90 = (ImGuiContext *)CONCAT44(local_90._4_4_,(window->Pos).y + fVar16);
    local_c8.Max.x = local_c8.Max.x - fVar16;
    local_c8.Max.y = (local_c8.Max.y - local_a8) - fVar16;
    local_88 = ImGuiWindow::TitleBarHeight(window);
    fVar16 = 0.0;
    if ((window->Flags & 0x400) != 0) {
      fVar16 = ImGuiWindow::MenuBarHeight(window);
    }
    local_c8.Min.y = local_90._0_4_ + local_88 + fVar16;
  }
  else {
    local_c8.Min.x = (window->Pos).x + fVar16;
    local_c8.Min.y = local_c8.Max.y - (pIVar3->Style).ScrollbarSize;
    local_c8.Max.x = (local_c8.Max.x - local_a8) - fVar16;
    local_c8.Max.y = local_c8.Max.y - fVar16;
  }
  uVar7 = window->Flags;
  local_90 = pIVar3;
  pfVar8 = &(pIVar3->Style).ChildWindowRounding;
  if ((uVar7 >> 0x14 & 1) == 0) {
    pfVar8 = &(pIVar3->Style).WindowRounding;
  }
  local_88 = *pfVar8;
  if (cVar13 == '\0') {
    iVar11 = (~uVar7 >> 9 & -(uVar7 & 1) & 2) + (uint)(bVar5 ^ 1) * 4;
    local_68._0_8_ = 0x28;
    uStack_e0 = 0x38;
  }
  else {
    iVar11 = (uint)(bVar5 ^ 1) * 4 + 8;
    local_68._0_8_ = 0x24;
    uStack_e0 = 0x34;
  }
  local_78._0_8_ = uStack_e0;
  this = window->DrawList;
  IVar6 = ImGui::GetColorU32(0xe,1.0);
  ImDrawList::AddRectFilled(this,&local_c8.Min,&local_c8.Max,IVar6,local_88,iVar11);
  pIVar3 = local_90;
  iVar11 = (int)(((local_c8.Max.x - local_c8.Min.x) + -2.0) * 0.5);
  iVar19 = (int)(((local_c8.Max.y - local_c8.Min.y) + -2.0) * 0.5);
  iVar21 = (int)(((local_c8.Max.x - local_c8.Max.x) + 0.0) * 0.0);
  iVar22 = (int)(((local_c8.Max.y - local_c8.Max.y) + 0.0) * 0.0);
  auVar30._0_4_ = (float)iVar11;
  auVar30._4_4_ = (float)iVar19;
  auVar30._8_4_ = (float)iVar21;
  auVar30._12_4_ = (float)iVar22;
  auVar30 = minps(_DAT_00182610,auVar30);
  auVar24._0_4_ = -(uint)(iVar11 < 0);
  auVar24._4_4_ = -(uint)(iVar19 < 0);
  auVar24._8_4_ = -(uint)(iVar21 < 0);
  auVar24._12_4_ = -(uint)(iVar22 < 0);
  auVar30 = ~auVar24 & auVar30;
  fStack_80 = auVar30._0_4_;
  fVar16 = auVar30._4_4_;
  auVar25._0_8_ = auVar30._0_8_;
  auVar25._8_4_ = fStack_80;
  auVar25._12_4_ = fVar16;
  local_c8.Min.x = local_c8.Min.x + fStack_80;
  fStack_80 = local_c8.Max.x - fStack_80;
  fStack_84 = local_c8.Max.y - fVar16;
  auVar2._4_8_ = auVar25._8_8_;
  auVar2._0_4_ = local_c8.Min.y - fVar16;
  auVar26._0_8_ = auVar2._0_8_ << 0x20;
  auVar26._8_4_ = fStack_80;
  auVar26._12_4_ = fStack_84;
  local_c8.Max = auVar26._8_8_;
  local_88 = local_c8.Min.x;
  if (!horizontal) {
    fStack_80 = fStack_84;
    local_88 = local_c8.Min.y + fVar16;
  }
  local_88 = fStack_80 - local_88;
  id = local_b8._0_4_;
  local_48._0_16_ = ZEXT416(*(uint *)((long)&window->Name + local_68._0_8_));
  local_78 = ZEXT416(*(uint *)((long)&window->Name + local_78._0_8_));
  local_b8 = ZEXT416((uint)(local_90->Style).GrabMinSize);
  local_68 = ZEXT416((uint)(&(window->Scroll).x)[!horizontal]);
  held = false;
  hovered = false;
  IVar1 = local_90->ActiveId;
  local_c8.Min.y = local_c8.Min.y + fVar16;
  fStack_7c = fStack_84;
  bVar5 = ImGui::ButtonBehavior(&local_c8,id,&hovered,&held,0);
  pIVar4 = GImGui;
  local_a8 = (float)local_48._0_4_ - local_a8;
  fVar16 = local_78._0_4_;
  fVar20 = local_78._4_4_;
  auVar31._4_12_ = local_78._4_12_;
  auVar31._0_4_ = fVar16 - local_a8;
  auVar33._0_8_ = auVar31._0_8_;
  auVar33._8_4_ = fVar20;
  auVar33._12_4_ = local_48._4_4_;
  auVar32._8_8_ = auVar33._8_8_;
  auVar32._4_4_ = local_a8;
  auVar32._0_4_ = auVar31._0_4_;
  auVar27._0_8_ =
       CONCAT44((uint)fVar16 & -(uint)(local_a8 <= fVar16),-(uint)(auVar31._0_4_ <= 1.0)) &
       0xffffffff3f800000;
  auVar27._8_4_ = 0;
  auVar27._12_4_ = (uint)fVar20 & -(uint)((float)local_48._4_4_ <= fVar20);
  auVar18._0_4_ = ~-(uint)(auVar31._0_4_ <= 1.0) & (uint)auVar31._0_4_;
  auVar18._4_4_ = ~-(uint)(local_a8 <= fVar16) & (uint)local_a8;
  auVar18._8_4_ = ~-(uint)(fVar20 <= 0.0) & (uint)fVar20;
  auVar18._12_4_ = ~-(uint)((float)local_48._4_4_ <= fVar20) & local_48._4_4_;
  auVar34._4_12_ = auVar32._4_12_;
  auVar34._0_4_ = local_68._0_4_;
  auVar30 = divps(auVar34,auVar18 | auVar27);
  fVar20 = auVar30._0_4_;
  fVar23 = auVar30._4_4_;
  iVar11 = -(uint)(fVar20 < 0.0);
  iVar19 = -(uint)(fVar23 < 0.0);
  auVar29._4_4_ = iVar19;
  auVar29._0_4_ = iVar11;
  auVar29._8_4_ = iVar19;
  auVar29._12_4_ = iVar19;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._4_4_ = iVar11;
  auVar28._0_4_ = iVar11;
  uVar7 = movmskpd((int)CONCAT71(extraout_var,bVar5),auVar28);
  fVar16 = 0.0;
  if (((uVar7 & 2) == 0) && (fVar16 = 1.0, fVar23 <= 1.0)) {
    fVar16 = fVar23;
  }
  uVar15 = -(uint)((float)local_b8._0_4_ <= fVar16 * local_88);
  local_a8 = (float)(~uVar15 & local_b8._0_4_ | (uint)(fVar16 * local_88) & uVar15);
  if (local_88 <= local_a8) {
    local_a8 = local_88;
  }
  fVar23 = local_a8 / local_88;
  fVar16 = 0.0;
  if (((uVar7 & 1) == 0) && (fVar16 = 1.0, fVar20 <= 1.0)) {
    fVar16 = fVar20;
  }
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  fVar16 = (fVar16 * (local_88 - local_a8)) / local_88;
  if (1.0 <= fVar23 || held != true) {
    local_b8._0_4_ = fVar16;
    goto LAB_0013e1cd;
  }
  pIVar9 = (ImRect *)&local_c8.Min.y;
  if (horizontal) {
    pIVar9 = &local_c8;
  }
  lVar12 = (ulong)!horizontal * 4;
  fVar35 = (*(float *)((pIVar3->IO).MouseDown + lVar12 + -8) - (pIVar9->Min).x) / local_88;
  fVar20 = 1.0;
  if (fVar35 <= 1.0) {
    fVar20 = fVar35;
  }
  fVar20 = (float)(~-(uint)(fVar35 < 0.0) & (uint)fVar20);
  GImGui->HoveredId = id;
  pIVar4->HoveredIdAllowOverlap = false;
  if (IVar1 == id) {
    fVar16 = *(float *)(pIVar3->Tooltip + lVar12 + -8);
LAB_0013e121:
    bVar5 = false;
  }
  else {
    if ((fVar16 <= fVar20) && (fVar20 <= fVar23 + fVar16)) {
      fVar16 = fVar23 * -0.5 + (fVar20 - fVar16);
      *(float *)(pIVar3->Tooltip + lVar12 + -8) = fVar16;
      goto LAB_0013e121;
    }
    pcVar10 = pIVar3->Tooltip + lVar12 + -8;
    pcVar10[0] = '\0';
    pcVar10[1] = '\0';
    pcVar10[2] = '\0';
    pcVar10[3] = '\0';
    bVar5 = true;
    fVar16 = 0.0;
  }
  fVar35 = ((fVar20 - fVar16) - fVar23 * 0.5) / (1.0 - fVar23);
  fVar16 = 1.0;
  if (fVar35 <= 1.0) {
    fVar16 = fVar35;
  }
  fVar17 = SUB164(auVar18 | auVar27,0);
  fVar16 = (float)(int)((float)(~-(uint)(fVar35 < 0.0) & (uint)fVar16) * fVar17 + 0.5);
  if (horizontal) {
    (window->Scroll).x = fVar16;
  }
  else {
    (window->Scroll).y = fVar16;
  }
  fVar16 = fVar16 / fVar17;
  fVar35 = 1.0;
  if (fVar16 <= 1.0) {
    fVar35 = fVar16;
  }
  local_b8._0_4_ =
       ((local_88 - local_a8) * (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar35)) / local_88;
  if (bVar5) {
    *(float *)(pIVar3->Tooltip + lVar12 + -8) = -fVar23 * 0.5 + (fVar20 - (float)local_b8._0_4_);
  }
LAB_0013e1cd:
  idx = 0x11;
  if (held == false) {
    idx = (hovered & 1) + 0xf;
  }
  IVar6 = ImGui::GetColorU32(idx,1.0);
  if (horizontal) {
    local_50.x = (local_c8.Max.x - local_c8.Min.x) * (float)local_b8._0_4_ + local_c8.Min.x;
    local_50.y = local_c8.Min.y;
    local_58.x = local_a8 + local_50.x;
    local_58.y = local_c8.Max.y;
  }
  else {
    local_50.y = (local_c8.Max.y - local_c8.Min.y) * (float)local_b8._0_4_ + local_c8.Min.y;
    local_50.x = local_c8.Min.x;
    local_58.y = local_a8 + local_50.y;
    local_58.x = local_c8.Max.x;
  }
  ImDrawList::AddRectFilled
            (window->DrawList,&local_50,&local_58,IVar6,(pIVar3->Style).ScrollbarRounding,0xf);
  return;
}

Assistant:

static void Scrollbar(ImGuiWindow* window, bool horizontal)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->BorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);

    float window_rounding = (window->Flags & ImGuiWindowFlags_ChildWindow) ? style.ChildWindowRounding : style.WindowRounding;
    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = 8 | (other_scrollbar ? 0 : 4);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? 2 : 0) | (other_scrollbar ? 0 : 4);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_ScrollbarBg), window_rounding, window_rounding_corners);
    bb.Reduce(ImVec2(ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main axis of the scrollbar
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->Size.x : window->Size.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // The grabable box size generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    const float grab_h_pixels = ImMin(ImMax(scrollbar_size_v * ImSaturate(win_size_avail_v / ImMax(win_size_contents_v, win_size_avail_v)), style.GrabMinSize), scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ImGui::ButtonBehavior(bb, id, &hovered, &held);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        ImGui::SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = ImGui::GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    if (horizontal)
        window->DrawList->AddRectFilled(ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y), ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y), grab_col, style.ScrollbarRounding);
    else
        window->DrawList->AddRectFilled(ImVec2(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm)), ImVec2(bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels), grab_col, style.ScrollbarRounding);
}